

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm_writer.cpp
# Opt level: O1

void __thiscall diffusion::ShmWriter::cyclic_write(ShmWriter *this,char *data,size_t size)

{
  int iVar1;
  uint32_t uVar2;
  int iVar3;
  ulong uVar4;
  
  uVar4 = size;
  if (0 < (int)size) {
    do {
      iVar3 = (int)uVar4;
      iVar1 = this->shm_body_size_ - this->writer_shm_body_offset_;
      if (iVar3 < iVar1) {
        iVar1 = iVar3;
      }
      memcpy(this->shm_body_position_ + (int)this->writer_shm_body_offset_,
             data + (size - (uVar4 & 0xffffffff)),(long)iVar1);
      uVar2 = this->writer_shm_body_offset_ + iVar1;
      if (uVar2 == this->shm_body_size_) {
        uVar2 = 0;
      }
      this->writer_shm_body_offset_ = uVar2;
      uVar4 = (ulong)(uint)(iVar3 - iVar1);
    } while (iVar3 - iVar1 != 0 && iVar1 <= iVar3);
  }
  return;
}

Assistant:

void ShmWriter::cyclic_write(char const *data, std::size_t size) {
    auto bytes_left = static_cast<Size>(size);
    while (bytes_left > 0) {
        auto start_position_unwritten_bytes = data + size - bytes_left;
        auto space_left = shm_body_size_ - static_cast<Size>(writer_shm_body_offset_);
        auto bytes_can_be_written_without_wrap = (bytes_left > space_left) ? space_left : bytes_left;
        std::memcpy(shm_body_position_ + static_cast<Offset>(writer_shm_body_offset_), start_position_unwritten_bytes, bytes_can_be_written_without_wrap);
        writer_shm_body_offset_ += bytes_can_be_written_without_wrap;
        bytes_left -= bytes_can_be_written_without_wrap;
        if (static_cast<Size>(writer_shm_body_offset_) == shm_body_size_) {
            writer_shm_body_offset_ = 0;
        }
    }
}